

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.hpp
# Opt level: O1

bool Diligent::PRSSerializer<(Diligent::SerializerMode)1>::
     SerializeInternalData<Diligent::PipelineResourceSignatureInternalDataVk>
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               ConstQual<Diligent::PipelineResourceSignatureInternalDataVk> *InternalData,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  
  bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (Ser,(SHADER_TYPE *)InternalData,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).StaticResShaderStages,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).PipelineType,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).StaticResStageIndex);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)1>::
            SerializeArray<Diligent::PipelineResourceAttribsVk_const*const,unsigned_int_const,Diligent::Serializer<(Diligent::SerializerMode)1>::SerializeArrayRaw<Diligent::PipelineResourceAttribsVk_const*const,unsigned_int_const>(Diligent::DynamicLinearAllocator*,Diligent::PipelineResourceAttribsVk_const*const&,unsigned_int_const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)1>&,auto:1&)_1_>
                      (Ser,Allocator,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                        ).pResourceAttribs,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                        ).NumResources);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)1>::
              SerializeArray<Diligent::ImmutableSamplerAttribsVk_const*const,unsigned_int_const,Diligent::Serializer<(Diligent::SerializerMode)1>::SerializeArrayRaw<Diligent::ImmutableSamplerAttribsVk_const*const,unsigned_int_const>(Diligent::DynamicLinearAllocator*,Diligent::ImmutableSamplerAttribsVk_const*const&,unsigned_int_const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)1>&,auto:1&)_1_>
                        (Ser,Allocator,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                          ).pImmutableSamplers,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                          ).NumImmutableSamplers);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool SerializeInternalData(Serializer<Mode>&                                     Ser,
                                      ConstQual<PipelineResourceSignatureInternalDataType>& InternalData,
                                      DynamicLinearAllocator*                               Allocator)
    {
        if (!Ser(InternalData.ShaderStages,
                 InternalData.StaticResShaderStages,
                 InternalData.PipelineType,
                 InternalData.StaticResStageIndex))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pResourceAttribs, InternalData.NumResources))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pImmutableSamplers, InternalData.NumImmutableSamplers))
            return false;

        return true;
    }